

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O2

size_t propagatemark(global_State *g)

{
  byte *pbVar1;
  uint8_t uVar2;
  char cVar3;
  byte bVar4;
  ushort uVar5;
  uint uVar6;
  int iVar7;
  GCtrace *T;
  uint64_t uVar8;
  ulong uVar9;
  SnapEntry *pSVar10;
  bool bVar11;
  cTValue *pcVar12;
  char *pcVar13;
  size_t sVar14;
  IRIns *pIVar15;
  uint uVar16;
  ulong *puVar17;
  GCobj *pGVar18;
  IRIns *pIVar19;
  IRIns *pIVar20;
  GCfunc *fn;
  uint32_t i;
  uint uVar21;
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  
  T = (GCtrace *)(g->gc).gray.gcptr64;
  uVar2 = T->gct;
  T->marked = T->marked | 4;
  (g->gc).gray.gcptr64 = (T->gclist).gcptr64;
  switch(uVar2) {
  case '\x06':
    (T->gclist).gcptr64 = (g->gc).grayagain.gcptr64;
    (g->gc).grayagain.gcptr64 = (uint64_t)T;
    T->marked = T->marked & 0xfb;
    puVar17 = *(ulong **)&T->nk;
    for (puVar23 = (ulong *)(T->snapmap + 4); puVar23 < puVar17; puVar23 = puVar23 + 1) {
      if (((int)((long)*puVar23 >> 0x2f) + 0xdU < 9) &&
         (pGVar18 = (GCobj *)(*puVar23 & 0x7fffffffffff), ((pGVar18->gch).marked & 3) != 0)) {
        gc_mark(g,pGVar18);
      }
    }
    if ((g->gc).state == '\x02') {
      uVar16 = *(uint *)&T->mcode;
      pSVar10 = T->snapmap;
      for (; puVar23 < pSVar10 + (ulong)uVar16 * 2; puVar23 = puVar23 + 1) {
        *puVar23 = 0xffffffffffffffff;
      }
    }
    pGVar18 = (GCobj *)(T->startpc).ptr64;
    if (((pGVar18->gch).marked & 3) != 0) {
      gc_mark(g,pGVar18);
    }
    pIVar19 = (IRIns *)(*(long *)&T->nk + -8);
    pIVar15 = T->ir + -1;
    while ((IRIns *)(T->snapmap + 2) < pIVar15) {
      pIVar20 = pIVar15;
      if (*(char *)(((ulong)pIVar15[-1] & 0x7fffffffffff) + 10) == '\0') {
        pIVar20 = pIVar15 + *(byte *)(*(long *)(((ulong)pIVar15[-1] & 0x7fffffffffff) + 0x20) +
                                     -0x5d);
      }
      if (pIVar19 < pIVar20) {
        pIVar19 = pIVar20;
      }
      uVar24 = *(ulong *)&pIVar15->i;
      if ((uVar24 & 3) == 0) {
        pIVar15 = pIVar15 + (-2 - (ulong)*(byte *)(uVar24 - 3));
      }
      else {
        pIVar15 = (IRIns *)((long)pIVar15 - (uVar24 & 0xfffffffffffffff8));
      }
    }
    pIVar15 = pIVar19 + 1;
    if ((IRIns *)T->snap < pIVar19 + 1) {
      pIVar15 = (IRIns *)T->snap;
    }
    lj_state_shrinkstack((lua_State *)T,(MSize)((ulong)((long)pIVar15 - (long)T->snapmap) >> 3));
    sVar14 = (ulong)*(uint *)&T->mcode * 8 + 0x70;
    break;
  case '\a':
    pbVar1 = (byte *)((T->startpt).gcptr64 + 8);
    *pbVar1 = *pbVar1 & 0xfc;
    for (lVar22 = -(ulong)*(uint *)&T->snap; lVar22 != 0; lVar22 = lVar22 + 1) {
      if ((*(byte *)((long)T->ir[lVar22] + 8) & 3) != 0) {
        gc_mark(g,(GCobj *)T->ir[lVar22]);
      }
    }
    uVar5 = *(ushort *)((long)&T->snapmap + 6);
    if (uVar5 != 0) {
      gc_marktrace(g,(uint)uVar5);
    }
    sVar14 = (size_t)*(uint *)&T->snapmap;
    break;
  case '\b':
    if ((((*(GCobj **)&T->unused_gc64)->gch).marked & 3) != 0) {
      gc_mark(g,*(GCobj **)&T->unused_gc64);
    }
    if ((char)T->nsnap == '\0') {
      if (((ulong)T->ir[-0xc] & 3) != 0) {
        gc_mark(g,(GCobj *)(T->ir + -0xd));
      }
      for (uVar24 = 0; bVar4 = *(byte *)((long)&T->nsnap + 1), uVar24 < bVar4; uVar24 = uVar24 + 1)
      {
        if ((((*(GCobj **)(&T->nk + uVar24 * 2))->gch).marked & 3) != 0) {
          gc_mark(g,*(GCobj **)(&T->nk + uVar24 * 2));
        }
      }
    }
    else {
      for (uVar24 = 0; bVar4 = *(byte *)((long)&T->nsnap + 1), uVar24 < bVar4; uVar24 = uVar24 + 1)
      {
        if (((int)((long)(&T->snap)[uVar24] >> 0x2f) + 0xdU < 9) &&
           (pGVar18 = (GCobj *)((ulong)(&T->snap)[uVar24] & 0x7fffffffffff),
           ((pGVar18->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar18);
        }
      }
    }
    if ((char)T->nsnap == '\0') {
      sVar14 = (ulong)bVar4 * 8 + 0x28;
    }
    else {
      sVar14 = (ulong)bVar4 * 8 + 0x30;
    }
    break;
  default:
    gc_traverse_trace(g,T);
    sVar14 = (ulong)T->nsnap * 0xc + (ulong)(T->nins - T->nk) * 8 + (ulong)T->nsnapmap * 4 + 0x78;
    break;
  case '\v':
    pGVar18 = (GCobj *)T->ir;
    uVar16 = 0;
    if (pGVar18 == (GCobj *)0x0) {
LAB_0010dd8a:
      uVar6 = *(uint *)&T->snap;
      for (uVar24 = 0; uVar6 != uVar24; uVar24 = uVar24 + 1) {
        uVar9 = *(ulong *)(*(long *)&T->unused_gc64 + uVar24 * 8);
        if (((int)((long)uVar9 >> 0x2f) + 0xdU < 9) &&
           (pGVar18 = (GCobj *)(uVar9 & 0x7fffffffffff), ((pGVar18->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar18);
        }
      }
      bVar11 = true;
LAB_0010ddc6:
      uVar6 = *(uint *)((long)&T->snap + 4);
      if (uVar6 != 0) {
        lVar22 = *(long *)&T->nk;
        for (uVar21 = 0; uVar21 <= uVar6; uVar21 = uVar21 + 1) {
          if (*(long *)(lVar22 + (ulong)uVar21 * 0x18) != -1) {
            puVar17 = (ulong *)((ulong)uVar21 * 0x18 + lVar22);
            if ((((uVar16 & 8) == 0) &&
                (uVar24 = puVar17[1], (int)((long)uVar24 >> 0x2f) + 0xdU < 9)) &&
               (pGVar18 = (GCobj *)(uVar24 & 0x7fffffffffff), ((pGVar18->gch).marked & 3) != 0)) {
              gc_mark(g,pGVar18);
            }
            if (((bVar11) && (uVar24 = *puVar17, (int)((long)uVar24 >> 0x2f) + 0xdU < 9)) &&
               (pGVar18 = (GCobj *)(uVar24 & 0x7fffffffffff), ((pGVar18->gch).marked & 3) != 0)) {
              gc_mark(g,pGVar18);
            }
          }
        }
      }
      if (0 < (int)uVar16) goto LAB_0010de79;
    }
    else {
      if (((pGVar18->gch).marked & 3) != 0) {
        gc_mark(g,pGVar18);
      }
      if (((((pGVar18->gch).unused1 & 8) != 0) ||
          (pcVar12 = lj_meta_cache(&pGVar18->tab,MM_mode,(GCstr *)g->gcroot[3].gcptr64),
          pcVar12 == (cTValue *)0x0)) || (uVar16 = 0, (pcVar12->field_4).it >> 0xf != 0x1fffb))
      goto LAB_0010dd8a;
      pcVar13 = (char *)(((ulong)pcVar12->field_4 & 0x7fffffffffff) + 0x18);
      uVar16 = 0;
      while (cVar3 = *pcVar13, cVar3 != '\0') {
        pcVar13 = pcVar13 + 1;
        if (cVar3 == 'v') {
          uVar16 = uVar16 | 0x10;
        }
        else if (cVar3 == 'k') {
          uVar16 = uVar16 | 8;
        }
      }
      if (uVar16 == 0) {
        uVar16 = 0;
        goto LAB_0010dd8a;
      }
      uVar8 = (g->ctype_state).ptr64;
      if ((uVar8 != 0) && (*(GCtrace **)(uVar8 + 0x20) == T)) {
        uVar16 = 0xffffffef;
        goto LAB_0010dd8a;
      }
      T->marked = (byte)uVar16 | T->marked & 0xe7;
      (T->gclist).gcptr64 = (g->gc).weak.gcptr64;
      (g->gc).weak.gcptr64 = (uint64_t)T;
      if (uVar16 != 0x18) {
        if ((uVar16 & 0x10) == 0) goto LAB_0010dd8a;
        bVar11 = false;
        goto LAB_0010ddc6;
      }
LAB_0010de79:
      T->marked = T->marked & 0xfb;
    }
    iVar7 = *(int *)((long)&T->snap + 4);
    lVar22 = 0;
    if (iVar7 != 0) {
      lVar22 = (ulong)(iVar7 + 1) * 0x18;
    }
    sVar14 = lVar22 + (ulong)*(uint *)&T->snap * 8 + 0x40;
  }
  return sVar14;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}